

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::Login(Character *this)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *this_00;
  element_type *this_01;
  allocator local_a9;
  string local_a8;
  Character *local_88;
  undefined1 local_80 [8];
  shared_ptr<Quest_Context> context;
  Quest *quest;
  key_type local_5a;
  _Self local_58;
  iterator it;
  string local_30;
  undefined1 local_10 [8];
  Character *this_local;
  
  local_10 = (undefined1  [8])this;
  CalculateStats(this,false);
  std::__cxx11::string::string((string *)&local_30,(string *)&this->quest_string);
  QuestUnserialize(&local_30,this);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::clear();
  GetQuest((Character *)&it,(short)this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&it);
  std::shared_ptr<Quest_Context>::~shared_ptr((shared_ptr<Quest_Context> *)&it);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_5a = 0;
    local_58._M_node =
         (_Base_ptr)
         std::
         map<short,_std::shared_ptr<Quest>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
         ::find(&this->world->quests,&local_5a);
    quest = (Quest *)std::
                     map<short,_std::shared_ptr<Quest>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
                     ::end(&this->world->quests);
    bVar1 = std::operator!=(&local_58,(_Self *)&quest);
    if (bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest>_>_>::operator->
                         (&local_58);
      context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(ppVar2->second).super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>);
      bVar1 = Quest::Disabled((Quest *)context.
                                       super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
      if (!bVar1) {
        local_88 = this;
        std::make_shared<Quest_Context,Character*,Quest*&>
                  ((Character **)local_80,(Quest **)&local_88);
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest>_>_>::
                 operator->(&local_58);
        this_00 = std::
                  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                  ::operator[](&this->quests,&ppVar2->first);
        std::shared_ptr<Quest_Context>::operator=(this_00,(shared_ptr<Quest_Context> *)local_80);
        this_01 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a8,"begin",&local_a9);
        EOPlus::Context::SetState(&this_01->super_Context,&local_a8,true);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        std::shared_ptr<Quest_Context>::~shared_ptr((shared_ptr<Quest_Context> *)local_80);
      }
    }
  }
  this->online = true;
  CalculateStats(this,true);
  return;
}

Assistant:

void Character::Login()
{
	this->CalculateStats(false);

	QuestUnserialize(this->quest_string, this);
	this->quest_string.clear();

	// Start the default 00000.eqf quest
	if (!this->GetQuest(0))
	{
		auto it = this->world->quests.find(0);

		if (it != this->world->quests.end())
		{
			// WARNING: holds a non-tracked reference to shared_ptr
			Quest *quest = it->second.get();

			if (!quest->Disabled())
			{
				auto context = std::make_shared<Quest_Context>(this, quest);
				this->quests[it->first] = context;
				context->SetState("begin");
			}
		}
	}

	this->online = true;

	this->CalculateStats();
}